

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

char * resultFilename(char *filename,char *out,char *suffix)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char res [500];
  char suffixbuff [500];
  char acStack_418 [499];
  undefined1 local_225;
  char local_218 [504];
  
  if (filename == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar3 = strlen(filename);
    pcVar4 = filename + sVar3;
    do {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4 + -1;
      if (pcVar4 <= filename) break;
      pcVar4 = pcVar5;
    } while (cVar1 != '/');
    pcVar5 = pcVar5 + (ulong)(cVar1 == '/') + 1;
  }
  pcVar4 = "";
  if (out != (char *)0x0) {
    pcVar4 = out;
  }
  strncpy(local_218,suffix,499);
  iVar2 = snprintf(acStack_418,499,"%s%s%s",pcVar4,pcVar5,local_218);
  if (0x1f2 < iVar2) {
    local_225 = 0;
  }
  pcVar5 = strdup(acStack_418);
  return pcVar5;
}

Assistant:

static char *resultFilename(const char *filename, const char *out,
                            const char *suffix) {
    const char *base;
    char res[500];
    char suffixbuff[500];

/*************
    if ((filename[0] == 't') && (filename[1] == 'e') &&
        (filename[2] == 's') && (filename[3] == 't') &&
	(filename[4] == '/'))
	filename = &filename[5];
 *************/

    base = baseFilename(filename);
    if (suffix == NULL)
        suffix = ".tmp";
    if (out == NULL)
        out = "";

    strncpy(suffixbuff,suffix,499);
#ifdef VMS
    if(strstr(base,".") && suffixbuff[0]=='.')
      suffixbuff[0]='_';
#endif

    if (snprintf(res, 499, "%s%s%s", out, base, suffixbuff) >= 499)
        res[499] = 0;
    return(strdup(res));
}